

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_Bech32.cpp
# Opt level: O0

void __thiscall Bech32Test_create_checksum_Test::TestBody(Bech32Test_create_checksum_Test *this)

{
  pointer *this_00;
  initializer_list<unsigned_char> __l;
  initializer_list<unsigned_char> __l_00;
  initializer_list<unsigned_char> __l_01;
  bool bVar1;
  reference pvVar2;
  char *pcVar3;
  vector<unsigned_char,_std::allocator<unsigned_char>_> *data_00;
  vector<unsigned_char,_std::allocator<unsigned_char>_> *data_01;
  vector<unsigned_char,_std::allocator<unsigned_char>_> *data_02;
  vector<unsigned_char,_std::allocator<unsigned_char>_> *data_03;
  vector<unsigned_char,_std::allocator<unsigned_char>_> *data_04;
  AssertHelper local_7d0;
  Message local_7c8;
  undefined1 local_7c0 [8];
  AssertionResult gtest_ar_34;
  AssertHelper local_790;
  Message local_788;
  char local_779;
  undefined1 local_778 [8];
  AssertionResult gtest_ar_33;
  Message local_760;
  char local_751;
  undefined1 local_750 [8];
  AssertionResult gtest_ar_32;
  Message local_738;
  char local_729;
  undefined1 local_728 [8];
  AssertionResult gtest_ar_31;
  Message local_710;
  char local_701;
  undefined1 local_700 [8];
  AssertionResult gtest_ar_30;
  Message local_6e8;
  char local_6d9;
  undefined1 local_6d8 [8];
  AssertionResult gtest_ar_29;
  Message local_6c0;
  char local_6b1;
  undefined1 local_6b0 [8];
  AssertionResult gtest_ar_28;
  uchar local_688 [96];
  iterator local_628;
  undefined8 local_620;
  AssertHelper local_618;
  Message local_610;
  undefined1 local_608 [8];
  AssertionResult gtest_ar_27;
  AssertHelper local_5d8;
  Message local_5d0;
  char local_5c1;
  undefined1 local_5c0 [8];
  AssertionResult gtest_ar_26;
  Message local_5a8;
  char local_599;
  undefined1 local_598 [8];
  AssertionResult gtest_ar_25;
  Message local_580;
  char local_571;
  undefined1 local_570 [8];
  AssertionResult gtest_ar_24;
  Message local_558;
  char local_549;
  undefined1 local_548 [8];
  AssertionResult gtest_ar_23;
  Message local_530;
  char local_521;
  undefined1 local_520 [8];
  AssertionResult gtest_ar_22;
  Message local_508;
  char local_4f9;
  undefined1 local_4f8 [8];
  AssertionResult gtest_ar_21;
  initializer_list<unsigned_char> local_4d0;
  AssertHelper local_4c0;
  Message local_4b8;
  undefined1 local_4b0 [8];
  AssertionResult gtest_ar_20;
  AssertHelper local_480;
  Message local_478;
  char local_469;
  undefined1 local_468 [8];
  AssertionResult gtest_ar_19;
  Message local_450;
  char local_441;
  undefined1 local_440 [8];
  AssertionResult gtest_ar_18;
  Message local_428;
  char local_419;
  undefined1 local_418 [8];
  AssertionResult gtest_ar_17;
  Message local_400;
  char local_3f1;
  undefined1 local_3f0 [8];
  AssertionResult gtest_ar_16;
  Message local_3d8;
  char local_3c9;
  undefined1 local_3c8 [8];
  AssertionResult gtest_ar_15;
  Message local_3b0;
  char local_3a1;
  undefined1 local_3a0 [8];
  AssertionResult gtest_ar_14;
  uchar local_378 [56];
  iterator local_340;
  undefined8 local_338;
  AssertHelper local_330;
  Message local_328;
  undefined1 local_320 [8];
  AssertionResult gtest_ar_13;
  AssertHelper local_2f0;
  Message local_2e8;
  char local_2d9;
  undefined1 local_2d8 [8];
  AssertionResult gtest_ar_12;
  Message local_2c0;
  char local_2b1;
  undefined1 local_2b0 [8];
  AssertionResult gtest_ar_11;
  Message local_298;
  char local_289;
  undefined1 local_288 [8];
  AssertionResult gtest_ar_10;
  Message local_270;
  char local_261;
  undefined1 local_260 [8];
  AssertionResult gtest_ar_9;
  Message local_248;
  char local_239;
  undefined1 local_238 [8];
  AssertionResult gtest_ar_8;
  Message local_220;
  char local_211;
  undefined1 local_210 [8];
  AssertionResult gtest_ar_7;
  uchar local_1e8 [40];
  iterator local_1c0;
  undefined8 local_1b8;
  AssertHelper local_1b0;
  Message local_1a8;
  undefined1 local_1a0 [8];
  AssertionResult gtest_ar_6;
  string mapped;
  Message local_168;
  char local_159;
  undefined1 local_158 [8];
  AssertionResult gtest_ar_5;
  Message local_140;
  char local_131;
  undefined1 local_130 [8];
  AssertionResult gtest_ar_4;
  Message local_118;
  char local_109;
  undefined1 local_108 [8];
  AssertionResult gtest_ar_3;
  Message local_f0;
  char local_e1;
  undefined1 local_e0 [8];
  AssertionResult gtest_ar_2;
  Message local_c8;
  char local_b9;
  undefined1 local_b8 [8];
  AssertionResult gtest_ar_1;
  AssertHelper local_a0;
  Message local_98;
  char local_89;
  undefined1 local_88 [8];
  AssertionResult gtest_ar;
  vector<unsigned_char,_std::allocator<unsigned_char>_> checksum;
  vector<unsigned_char,_std::allocator<unsigned_char>_> data;
  allocator<char> local_31;
  undefined1 local_30 [8];
  string hrp;
  Bech32Test_create_checksum_Test *this_local;
  
  hrp.field_2._8_8_ = this;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)local_30,"a",&local_31);
  std::allocator<char>::~allocator(&local_31);
  this_00 = &checksum.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
             super__Vector_impl_data._M_end_of_storage;
  std::vector<unsigned_char,_std::allocator<unsigned_char>_>::vector
            ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)this_00);
  anon_unknown.dwarf_3638a::createChecksum
            ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)&gtest_ar.message_,
             (string *)local_30,(vector<unsigned_char,_std::allocator<unsigned_char>_> *)this_00);
  pvVar2 = std::vector<unsigned_char,_std::allocator<unsigned_char>_>::operator[]
                     ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)&gtest_ar.message_,0)
  ;
  local_89 = '\x1f';
  testing::internal::EqHelper::Compare<unsigned_char,_char,_nullptr>
            ((EqHelper *)local_88,"checksum[0]","\'\\x1F\'",pvVar2,&local_89);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_88);
  if (!bVar1) {
    testing::Message::Message(&local_98);
    pcVar3 = testing::AssertionResult::failure_message((AssertionResult *)local_88);
    testing::internal::AssertHelper::AssertHelper
              (&local_a0,kFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/dcdpr[P]libbech32/test/testbech32/test_Bech32.cpp"
               ,0x240,pcVar3);
    testing::internal::AssertHelper::operator=(&local_a0,&local_98);
    testing::internal::AssertHelper::~AssertHelper(&local_a0);
    testing::Message::~Message(&local_98);
  }
  gtest_ar_1.message_._M_t.
  super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_t.
  super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  .
  super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
  ._M_head_impl._5_3_ = 0;
  gtest_ar_1.message_._M_t.
  super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_t.
  super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  .
  super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
  ._M_head_impl._4_1_ = !bVar1;
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_88);
  if (gtest_ar_1.message_._M_t.
      super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_t.
      super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      .
      super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
      ._M_head_impl._4_4_ == 0) {
    pvVar2 = std::vector<unsigned_char,_std::allocator<unsigned_char>_>::operator[]
                       ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)&gtest_ar.message_,
                        1);
    local_b9 = '\0';
    testing::internal::EqHelper::Compare<unsigned_char,_char,_nullptr>
              ((EqHelper *)local_b8,"checksum[1]","\'\\x00\'",pvVar2,&local_b9);
    bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_b8);
    if (!bVar1) {
      testing::Message::Message(&local_c8);
      pcVar3 = testing::AssertionResult::failure_message((AssertionResult *)local_b8);
      testing::internal::AssertHelper::AssertHelper
                ((AssertHelper *)&gtest_ar_2.message_,kFatalFailure,
                 "/workspace/llm4binary/github/license_all_cmakelists_1510/dcdpr[P]libbech32/test/testbech32/test_Bech32.cpp"
                 ,0x241,pcVar3);
      testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar_2.message_,&local_c8);
      testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_2.message_);
      testing::Message::~Message(&local_c8);
    }
    gtest_ar_1.message_._M_t.
    super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_t.
    super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    .
    super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
    ._M_head_impl._5_3_ = 0;
    gtest_ar_1.message_._M_t.
    super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_t.
    super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    .
    super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
    ._M_head_impl._4_1_ = !bVar1;
    testing::AssertionResult::~AssertionResult((AssertionResult *)local_b8);
    if (gtest_ar_1.message_._M_t.
        super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ._M_t.
        super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        .
        super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
        ._M_head_impl._4_4_ == 0) {
      pvVar2 = std::vector<unsigned_char,_std::allocator<unsigned_char>_>::operator[]
                         ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)
                          &gtest_ar.message_,2);
      local_e1 = '\t';
      testing::internal::EqHelper::Compare<unsigned_char,_char,_nullptr>
                ((EqHelper *)local_e0,"checksum[2]","\'\\x09\'",pvVar2,&local_e1);
      bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_e0);
      if (!bVar1) {
        testing::Message::Message(&local_f0);
        pcVar3 = testing::AssertionResult::failure_message((AssertionResult *)local_e0);
        testing::internal::AssertHelper::AssertHelper
                  ((AssertHelper *)&gtest_ar_3.message_,kFatalFailure,
                   "/workspace/llm4binary/github/license_all_cmakelists_1510/dcdpr[P]libbech32/test/testbech32/test_Bech32.cpp"
                   ,0x242,pcVar3);
        testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar_3.message_,&local_f0);
        testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_3.message_);
        testing::Message::~Message(&local_f0);
      }
      gtest_ar_1.message_._M_t.
      super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_t.
      super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      .
      super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
      ._M_head_impl._5_3_ = 0;
      gtest_ar_1.message_._M_t.
      super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_t.
      super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      .
      super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
      ._M_head_impl._4_1_ = !bVar1;
      testing::AssertionResult::~AssertionResult((AssertionResult *)local_e0);
      if (gtest_ar_1.message_._M_t.
          super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ._M_t.
          super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          .
          super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
          ._M_head_impl._4_4_ == 0) {
        pvVar2 = std::vector<unsigned_char,_std::allocator<unsigned_char>_>::operator[]
                           ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)
                            &gtest_ar.message_,3);
        local_109 = '\x13';
        testing::internal::EqHelper::Compare<unsigned_char,_char,_nullptr>
                  ((EqHelper *)local_108,"checksum[3]","\'\\x13\'",pvVar2,&local_109);
        bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_108);
        if (!bVar1) {
          testing::Message::Message(&local_118);
          pcVar3 = testing::AssertionResult::failure_message((AssertionResult *)local_108);
          testing::internal::AssertHelper::AssertHelper
                    ((AssertHelper *)&gtest_ar_4.message_,kFatalFailure,
                     "/workspace/llm4binary/github/license_all_cmakelists_1510/dcdpr[P]libbech32/test/testbech32/test_Bech32.cpp"
                     ,0x243,pcVar3);
          testing::internal::AssertHelper::operator=
                    ((AssertHelper *)&gtest_ar_4.message_,&local_118);
          testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_4.message_);
          testing::Message::~Message(&local_118);
        }
        gtest_ar_1.message_._M_t.
        super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ._M_t.
        super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        .
        super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
        ._M_head_impl._5_3_ = 0;
        gtest_ar_1.message_._M_t.
        super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ._M_t.
        super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        .
        super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
        ._M_head_impl._4_1_ = !bVar1;
        testing::AssertionResult::~AssertionResult((AssertionResult *)local_108);
        if (gtest_ar_1.message_._M_t.
            super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            ._M_t.
            super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            .
            super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
            ._M_head_impl._4_4_ == 0) {
          pvVar2 = std::vector<unsigned_char,_std::allocator<unsigned_char>_>::operator[]
                             ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)
                              &gtest_ar.message_,4);
          local_131 = '\x11';
          testing::internal::EqHelper::Compare<unsigned_char,_char,_nullptr>
                    ((EqHelper *)local_130,"checksum[4]","\'\\x11\'",pvVar2,&local_131);
          bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_130);
          if (!bVar1) {
            testing::Message::Message(&local_140);
            pcVar3 = testing::AssertionResult::failure_message((AssertionResult *)local_130);
            testing::internal::AssertHelper::AssertHelper
                      ((AssertHelper *)&gtest_ar_5.message_,kFatalFailure,
                       "/workspace/llm4binary/github/license_all_cmakelists_1510/dcdpr[P]libbech32/test/testbech32/test_Bech32.cpp"
                       ,0x244,pcVar3);
            testing::internal::AssertHelper::operator=
                      ((AssertHelper *)&gtest_ar_5.message_,&local_140);
            testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_5.message_);
            testing::Message::~Message(&local_140);
          }
          gtest_ar_1.message_._M_t.
          super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ._M_t.
          super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          .
          super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
          ._M_head_impl._5_3_ = 0;
          gtest_ar_1.message_._M_t.
          super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ._M_t.
          super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          .
          super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
          ._M_head_impl._4_1_ = !bVar1;
          testing::AssertionResult::~AssertionResult((AssertionResult *)local_130);
          if (gtest_ar_1.message_._M_t.
              super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              ._M_t.
              super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              .
              super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
              ._M_head_impl._4_4_ == 0) {
            pvVar2 = std::vector<unsigned_char,_std::allocator<unsigned_char>_>::operator[]
                               ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)
                                &gtest_ar.message_,5);
            local_159 = '\x1d';
            testing::internal::EqHelper::Compare<unsigned_char,_char,_nullptr>
                      ((EqHelper *)local_158,"checksum[5]","\'\\x1D\'",pvVar2,&local_159);
            bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_158);
            if (!bVar1) {
              testing::Message::Message(&local_168);
              pcVar3 = testing::AssertionResult::failure_message((AssertionResult *)local_158);
              testing::internal::AssertHelper::AssertHelper
                        ((AssertHelper *)((long)&mapped.field_2 + 8),kFatalFailure,
                         "/workspace/llm4binary/github/license_all_cmakelists_1510/dcdpr[P]libbech32/test/testbech32/test_Bech32.cpp"
                         ,0x245,pcVar3);
              testing::internal::AssertHelper::operator=
                        ((AssertHelper *)((long)&mapped.field_2 + 8),&local_168);
              testing::internal::AssertHelper::~AssertHelper
                        ((AssertHelper *)((long)&mapped.field_2 + 8));
              testing::Message::~Message(&local_168);
            }
            gtest_ar_1.message_._M_t.
            super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            ._M_t.
            super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            .
            super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
            ._M_head_impl._5_3_ = 0;
            gtest_ar_1.message_._M_t.
            super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            ._M_t.
            super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            .
            super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
            ._M_head_impl._4_1_ = !bVar1;
            testing::AssertionResult::~AssertionResult((AssertionResult *)local_158);
            if (gtest_ar_1.message_._M_t.
                super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                ._M_t.
                super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                .
                super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                ._M_head_impl._4_4_ == 0) {
              (anonymous_namespace)::mapToCharset_abi_cxx11_
                        ((string *)&gtest_ar_6.message_,(_anonymous_namespace_ *)&gtest_ar.message_,
                         data_00);
              testing::internal::EqHelper::
              Compare<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_char[7],_nullptr>
                        ((EqHelper *)local_1a0,"mapped","\"lqfn3a\"",
                         (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                         &gtest_ar_6.message_,(char (*) [7])0x206586);
              bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_1a0);
              if (!bVar1) {
                testing::Message::Message(&local_1a8);
                pcVar3 = testing::AssertionResult::failure_message((AssertionResult *)local_1a0);
                testing::internal::AssertHelper::AssertHelper
                          (&local_1b0,kFatalFailure,
                           "/workspace/llm4binary/github/license_all_cmakelists_1510/dcdpr[P]libbech32/test/testbech32/test_Bech32.cpp"
                           ,0x249,pcVar3);
                testing::internal::AssertHelper::operator=(&local_1b0,&local_1a8);
                testing::internal::AssertHelper::~AssertHelper(&local_1b0);
                testing::Message::~Message(&local_1a8);
              }
              gtest_ar_1.message_._M_t.
              super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              ._M_t.
              super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              .
              super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
              ._M_head_impl._5_3_ = 0;
              gtest_ar_1.message_._M_t.
              super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              ._M_t.
              super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              .
              super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
              ._M_head_impl._4_1_ = !bVar1;
              testing::AssertionResult::~AssertionResult((AssertionResult *)local_1a0);
              if (gtest_ar_1.message_._M_t.
                  super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  ._M_t.
                  super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  .
                  super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                  ._M_head_impl._4_4_ == 0) {
                std::__cxx11::string::operator=((string *)local_30,"abcdef");
                builtin_memcpy(local_1e8 + 0x10,"0wdvt2fg8x9yrzpq",0x10);
                builtin_memcpy(local_1e8,"l7aum6echk45nj3s",0x10);
                local_1c0 = local_1e8;
                local_1b8 = 0x20;
                __l_01._M_len = 0x20;
                __l_01._M_array = local_1c0;
                std::vector<unsigned_char,_std::allocator<unsigned_char>_>::operator=
                          ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)
                           &checksum.
                            super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                            _M_impl.super__Vector_impl_data._M_end_of_storage,__l_01);
                anon_unknown.dwarf_3638a::mapDP
                          ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)
                           &checksum.
                            super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                            _M_impl.super__Vector_impl_data._M_end_of_storage);
                anon_unknown.dwarf_3638a::createChecksum
                          ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)
                           &gtest_ar_7.message_,(string *)local_30,
                           (vector<unsigned_char,_std::allocator<unsigned_char>_> *)
                           &checksum.
                            super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                            _M_impl.super__Vector_impl_data._M_end_of_storage);
                std::vector<unsigned_char,_std::allocator<unsigned_char>_>::operator=
                          ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)
                           &gtest_ar.message_,
                           (vector<unsigned_char,_std::allocator<unsigned_char>_> *)
                           &gtest_ar_7.message_);
                std::vector<unsigned_char,_std::allocator<unsigned_char>_>::~vector
                          ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)
                           &gtest_ar_7.message_);
                pvVar2 = std::vector<unsigned_char,_std::allocator<unsigned_char>_>::operator[]
                                   ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)
                                    &gtest_ar.message_,0);
                local_211 = '\x02';
                testing::internal::EqHelper::Compare<unsigned_char,_char,_nullptr>
                          ((EqHelper *)local_210,"checksum[0]","\'\\x02\'",pvVar2,&local_211);
                bVar1 = testing::AssertionResult::operator_cast_to_bool
                                  ((AssertionResult *)local_210);
                if (!bVar1) {
                  testing::Message::Message(&local_220);
                  pcVar3 = testing::AssertionResult::failure_message((AssertionResult *)local_210);
                  testing::internal::AssertHelper::AssertHelper
                            ((AssertHelper *)&gtest_ar_8.message_,kFatalFailure,
                             "/workspace/llm4binary/github/license_all_cmakelists_1510/dcdpr[P]libbech32/test/testbech32/test_Bech32.cpp"
                             ,0x254,pcVar3);
                  testing::internal::AssertHelper::operator=
                            ((AssertHelper *)&gtest_ar_8.message_,&local_220);
                  testing::internal::AssertHelper::~AssertHelper
                            ((AssertHelper *)&gtest_ar_8.message_);
                  testing::Message::~Message(&local_220);
                }
                gtest_ar_1.message_._M_t.
                super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                ._M_t.
                super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                .
                super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                ._M_head_impl._5_3_ = 0;
                gtest_ar_1.message_._M_t.
                super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                ._M_t.
                super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                .
                super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                ._M_head_impl._4_1_ = !bVar1;
                testing::AssertionResult::~AssertionResult((AssertionResult *)local_210);
                if (gtest_ar_1.message_._M_t.
                    super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    ._M_t.
                    super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    .
                    super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                    ._M_head_impl._4_4_ == 0) {
                  pvVar2 = std::vector<unsigned_char,_std::allocator<unsigned_char>_>::operator[]
                                     ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)
                                      &gtest_ar.message_,1);
                  local_239 = '\r';
                  testing::internal::EqHelper::Compare<unsigned_char,_char,_nullptr>
                            ((EqHelper *)local_238,"checksum[1]","\'\\x0D\'",pvVar2,&local_239);
                  bVar1 = testing::AssertionResult::operator_cast_to_bool
                                    ((AssertionResult *)local_238);
                  if (!bVar1) {
                    testing::Message::Message(&local_248);
                    pcVar3 = testing::AssertionResult::failure_message((AssertionResult *)local_238)
                    ;
                    testing::internal::AssertHelper::AssertHelper
                              ((AssertHelper *)&gtest_ar_9.message_,kFatalFailure,
                               "/workspace/llm4binary/github/license_all_cmakelists_1510/dcdpr[P]libbech32/test/testbech32/test_Bech32.cpp"
                               ,0x255,pcVar3);
                    testing::internal::AssertHelper::operator=
                              ((AssertHelper *)&gtest_ar_9.message_,&local_248);
                    testing::internal::AssertHelper::~AssertHelper
                              ((AssertHelper *)&gtest_ar_9.message_);
                    testing::Message::~Message(&local_248);
                  }
                  gtest_ar_1.message_._M_t.
                  super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  ._M_t.
                  super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  .
                  super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                  ._M_head_impl._5_3_ = 0;
                  gtest_ar_1.message_._M_t.
                  super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  ._M_t.
                  super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  .
                  super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                  ._M_head_impl._4_1_ = !bVar1;
                  testing::AssertionResult::~AssertionResult((AssertionResult *)local_238);
                  if (gtest_ar_1.message_._M_t.
                      super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                      ._M_t.
                      super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                      .
                      super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                      ._M_head_impl._4_4_ == 0) {
                    pvVar2 = std::vector<unsigned_char,_std::allocator<unsigned_char>_>::operator[]
                                       ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)
                                        &gtest_ar.message_,2);
                    local_261 = '\x11';
                    testing::internal::EqHelper::Compare<unsigned_char,_char,_nullptr>
                              ((EqHelper *)local_260,"checksum[2]","\'\\x11\'",pvVar2,&local_261);
                    bVar1 = testing::AssertionResult::operator_cast_to_bool
                                      ((AssertionResult *)local_260);
                    if (!bVar1) {
                      testing::Message::Message(&local_270);
                      pcVar3 = testing::AssertionResult::failure_message
                                         ((AssertionResult *)local_260);
                      testing::internal::AssertHelper::AssertHelper
                                ((AssertHelper *)&gtest_ar_10.message_,kFatalFailure,
                                 "/workspace/llm4binary/github/license_all_cmakelists_1510/dcdpr[P]libbech32/test/testbech32/test_Bech32.cpp"
                                 ,0x256,pcVar3);
                      testing::internal::AssertHelper::operator=
                                ((AssertHelper *)&gtest_ar_10.message_,&local_270);
                      testing::internal::AssertHelper::~AssertHelper
                                ((AssertHelper *)&gtest_ar_10.message_);
                      testing::Message::~Message(&local_270);
                    }
                    gtest_ar_1.message_._M_t.
                    super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    ._M_t.
                    super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    .
                    super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                    ._M_head_impl._5_3_ = 0;
                    gtest_ar_1.message_._M_t.
                    super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    ._M_t.
                    super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    .
                    super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                    ._M_head_impl._4_1_ = !bVar1;
                    testing::AssertionResult::~AssertionResult((AssertionResult *)local_260);
                    if (gtest_ar_1.message_._M_t.
                        super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                        ._M_t.
                        super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                        .
                        super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                        ._M_head_impl._4_4_ == 0) {
                      pvVar2 = std::vector<unsigned_char,_std::allocator<unsigned_char>_>::
                               operator[]((vector<unsigned_char,_std::allocator<unsigned_char>_> *)
                                          &gtest_ar.message_,3);
                      local_289 = '\x03';
                      testing::internal::EqHelper::Compare<unsigned_char,_char,_nullptr>
                                ((EqHelper *)local_288,"checksum[3]","\'\\x03\'",pvVar2,&local_289);
                      bVar1 = testing::AssertionResult::operator_cast_to_bool
                                        ((AssertionResult *)local_288);
                      if (!bVar1) {
                        testing::Message::Message(&local_298);
                        pcVar3 = testing::AssertionResult::failure_message
                                           ((AssertionResult *)local_288);
                        testing::internal::AssertHelper::AssertHelper
                                  ((AssertHelper *)&gtest_ar_11.message_,kFatalFailure,
                                   "/workspace/llm4binary/github/license_all_cmakelists_1510/dcdpr[P]libbech32/test/testbech32/test_Bech32.cpp"
                                   ,599,pcVar3);
                        testing::internal::AssertHelper::operator=
                                  ((AssertHelper *)&gtest_ar_11.message_,&local_298);
                        testing::internal::AssertHelper::~AssertHelper
                                  ((AssertHelper *)&gtest_ar_11.message_);
                        testing::Message::~Message(&local_298);
                      }
                      gtest_ar_1.message_._M_t.
                      super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                      ._M_t.
                      super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                      .
                      super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                      ._M_head_impl._5_3_ = 0;
                      gtest_ar_1.message_._M_t.
                      super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                      ._M_t.
                      super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                      .
                      super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                      ._M_head_impl._4_1_ = !bVar1;
                      testing::AssertionResult::~AssertionResult((AssertionResult *)local_288);
                      if (gtest_ar_1.message_._M_t.
                          super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                          ._M_t.
                          super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                          .
                          super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                          ._M_head_impl._4_4_ == 0) {
                        pvVar2 = std::vector<unsigned_char,_std::allocator<unsigned_char>_>::
                                 operator[]((vector<unsigned_char,_std::allocator<unsigned_char>_> *
                                            )&gtest_ar.message_,4);
                        local_2b1 = '\x04';
                        testing::internal::EqHelper::Compare<unsigned_char,_char,_nullptr>
                                  ((EqHelper *)local_2b0,"checksum[4]","\'\\x04\'",pvVar2,&local_2b1
                                  );
                        bVar1 = testing::AssertionResult::operator_cast_to_bool
                                          ((AssertionResult *)local_2b0);
                        if (!bVar1) {
                          testing::Message::Message(&local_2c0);
                          pcVar3 = testing::AssertionResult::failure_message
                                             ((AssertionResult *)local_2b0);
                          testing::internal::AssertHelper::AssertHelper
                                    ((AssertHelper *)&gtest_ar_12.message_,kFatalFailure,
                                     "/workspace/llm4binary/github/license_all_cmakelists_1510/dcdpr[P]libbech32/test/testbech32/test_Bech32.cpp"
                                     ,600,pcVar3);
                          testing::internal::AssertHelper::operator=
                                    ((AssertHelper *)&gtest_ar_12.message_,&local_2c0);
                          testing::internal::AssertHelper::~AssertHelper
                                    ((AssertHelper *)&gtest_ar_12.message_);
                          testing::Message::~Message(&local_2c0);
                        }
                        gtest_ar_1.message_._M_t.
                        super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                        ._M_t.
                        super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                        .
                        super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                        ._M_head_impl._5_3_ = 0;
                        gtest_ar_1.message_._M_t.
                        super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                        ._M_t.
                        super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                        .
                        super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                        ._M_head_impl._4_1_ = !bVar1;
                        testing::AssertionResult::~AssertionResult((AssertionResult *)local_2b0);
                        if (gtest_ar_1.message_._M_t.
                            super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                            ._M_t.
                            super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                            .
                            super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                            ._M_head_impl._4_4_ == 0) {
                          pvVar2 = std::vector<unsigned_char,_std::allocator<unsigned_char>_>::
                                   operator[]((vector<unsigned_char,_std::allocator<unsigned_char>_>
                                               *)&gtest_ar.message_,5);
                          local_2d9 = '\x06';
                          testing::internal::EqHelper::Compare<unsigned_char,_char,_nullptr>
                                    ((EqHelper *)local_2d8,"checksum[5]","\'\\x06\'",pvVar2,
                                     &local_2d9);
                          bVar1 = testing::AssertionResult::operator_cast_to_bool
                                            ((AssertionResult *)local_2d8);
                          if (!bVar1) {
                            testing::Message::Message(&local_2e8);
                            pcVar3 = testing::AssertionResult::failure_message
                                               ((AssertionResult *)local_2d8);
                            testing::internal::AssertHelper::AssertHelper
                                      (&local_2f0,kFatalFailure,
                                       "/workspace/llm4binary/github/license_all_cmakelists_1510/dcdpr[P]libbech32/test/testbech32/test_Bech32.cpp"
                                       ,0x259,pcVar3);
                            testing::internal::AssertHelper::operator=(&local_2f0,&local_2e8);
                            testing::internal::AssertHelper::~AssertHelper(&local_2f0);
                            testing::Message::~Message(&local_2e8);
                          }
                          gtest_ar_1.message_._M_t.
                          super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                          ._M_t.
                          super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                          .
                          super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                          ._M_head_impl._5_3_ = 0;
                          gtest_ar_1.message_._M_t.
                          super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                          ._M_t.
                          super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                          .
                          super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                          ._M_head_impl._4_1_ = !bVar1;
                          testing::AssertionResult::~AssertionResult((AssertionResult *)local_2d8);
                          if (gtest_ar_1.message_._M_t.
                              super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                              ._M_t.
                              super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                              .
                              super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                              ._M_head_impl._4_4_ == 0) {
                            (anonymous_namespace)::mapToCharset_abi_cxx11_
                                      ((string *)&gtest_ar_13.message_,
                                       (_anonymous_namespace_ *)&gtest_ar.message_,data_01);
                            std::__cxx11::string::operator=
                                      ((string *)&gtest_ar_6.message_,
                                       (string *)&gtest_ar_13.message_);
                            std::__cxx11::string::~string((string *)&gtest_ar_13.message_);
                            testing::internal::EqHelper::
                            Compare<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_char[7],_nullptr>
                                      ((EqHelper *)local_320,"mapped","\"zd3ryx\"",
                                       (basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                        *)&gtest_ar_6.message_,(char (*) [7])0x2065d5);
                            bVar1 = testing::AssertionResult::operator_cast_to_bool
                                              ((AssertionResult *)local_320);
                            if (!bVar1) {
                              testing::Message::Message(&local_328);
                              pcVar3 = testing::AssertionResult::failure_message
                                                 ((AssertionResult *)local_320);
                              testing::internal::AssertHelper::AssertHelper
                                        (&local_330,kFatalFailure,
                                         "/workspace/llm4binary/github/license_all_cmakelists_1510/dcdpr[P]libbech32/test/testbech32/test_Bech32.cpp"
                                         ,0x25d,pcVar3);
                              testing::internal::AssertHelper::operator=(&local_330,&local_328);
                              testing::internal::AssertHelper::~AssertHelper(&local_330);
                              testing::Message::~Message(&local_328);
                            }
                            gtest_ar_1.message_._M_t.
                            super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                            ._M_t.
                            super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                            .
                            super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                            ._M_head_impl._5_3_ = 0;
                            gtest_ar_1.message_._M_t.
                            super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                            ._M_t.
                            super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                            .
                            super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                            ._M_head_impl._4_1_ = !bVar1;
                            testing::AssertionResult::~AssertionResult((AssertionResult *)local_320)
                            ;
                            if (gtest_ar_1.message_._M_t.
                                super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                ._M_t.
                                super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                .
                                super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                                ._M_head_impl._4_4_ == 0) {
                              std::__cxx11::string::operator=((string *)local_30,"split");
                              builtin_memcpy(local_378 + 0x20,"anterredcaperred",0x10);
                              builtin_memcpy(local_378 + 0x10,"shakeupstreamerr",0x10);
                              builtin_memcpy(local_378,"checkupstagehand",0x10);
                              local_340 = local_378;
                              local_338 = 0x30;
                              __l_00._M_len = 0x30;
                              __l_00._M_array = local_340;
                              std::vector<unsigned_char,_std::allocator<unsigned_char>_>::operator=
                                        ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)
                                         &checksum.
                                          super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
                                          ._M_impl.super__Vector_impl_data._M_end_of_storage,__l_00)
                              ;
                              anon_unknown.dwarf_3638a::mapDP
                                        ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)
                                         &checksum.
                                          super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
                                          ._M_impl.super__Vector_impl_data._M_end_of_storage);
                              anon_unknown.dwarf_3638a::createChecksum
                                        ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)
                                         &gtest_ar_14.message_,(string *)local_30,
                                         (vector<unsigned_char,_std::allocator<unsigned_char>_> *)
                                         &checksum.
                                          super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
                                          ._M_impl.super__Vector_impl_data._M_end_of_storage);
                              std::vector<unsigned_char,_std::allocator<unsigned_char>_>::operator=
                                        ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)
                                         &gtest_ar.message_,
                                         (vector<unsigned_char,_std::allocator<unsigned_char>_> *)
                                         &gtest_ar_14.message_);
                              std::vector<unsigned_char,_std::allocator<unsigned_char>_>::~vector
                                        ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)
                                         &gtest_ar_14.message_);
                              pvVar2 = std::vector<unsigned_char,_std::allocator<unsigned_char>_>::
                                       operator[]((
                                                  vector<unsigned_char,_std::allocator<unsigned_char>_>
                                                  *)&gtest_ar.message_,0);
                              local_3a1 = '\x1f';
                              testing::internal::EqHelper::Compare<unsigned_char,_char,_nullptr>
                                        ((EqHelper *)local_3a0,"checksum[0]","\'\\x1F\'",pvVar2,
                                         &local_3a1);
                              bVar1 = testing::AssertionResult::operator_cast_to_bool
                                                ((AssertionResult *)local_3a0);
                              if (!bVar1) {
                                testing::Message::Message(&local_3b0);
                                pcVar3 = testing::AssertionResult::failure_message
                                                   ((AssertionResult *)local_3a0);
                                testing::internal::AssertHelper::AssertHelper
                                          ((AssertHelper *)&gtest_ar_15.message_,kFatalFailure,
                                           "/workspace/llm4binary/github/license_all_cmakelists_1510/dcdpr[P]libbech32/test/testbech32/test_Bech32.cpp"
                                           ,0x269,pcVar3);
                                testing::internal::AssertHelper::operator=
                                          ((AssertHelper *)&gtest_ar_15.message_,&local_3b0);
                                testing::internal::AssertHelper::~AssertHelper
                                          ((AssertHelper *)&gtest_ar_15.message_);
                                testing::Message::~Message(&local_3b0);
                              }
                              gtest_ar_1.message_._M_t.
                              super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                              ._M_t.
                              super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                              .
                              super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                              ._M_head_impl._5_3_ = 0;
                              gtest_ar_1.message_._M_t.
                              super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                              ._M_t.
                              super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                              .
                              super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                              ._M_head_impl._4_1_ = !bVar1;
                              testing::AssertionResult::~AssertionResult
                                        ((AssertionResult *)local_3a0);
                              if (gtest_ar_1.message_._M_t.
                                  super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                  ._M_t.
                                  super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                  .
                                  super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                                  ._M_head_impl._4_4_ == 0) {
                                pvVar2 = std::vector<unsigned_char,_std::allocator<unsigned_char>_>
                                         ::operator[]((
                                                  vector<unsigned_char,_std::allocator<unsigned_char>_>
                                                  *)&gtest_ar.message_,1);
                                local_3c9 = '\x18';
                                testing::internal::EqHelper::Compare<unsigned_char,_char,_nullptr>
                                          ((EqHelper *)local_3c8,"checksum[1]","\'\\x18\'",pvVar2,
                                           &local_3c9);
                                bVar1 = testing::AssertionResult::operator_cast_to_bool
                                                  ((AssertionResult *)local_3c8);
                                if (!bVar1) {
                                  testing::Message::Message(&local_3d8);
                                  pcVar3 = testing::AssertionResult::failure_message
                                                     ((AssertionResult *)local_3c8);
                                  testing::internal::AssertHelper::AssertHelper
                                            ((AssertHelper *)&gtest_ar_16.message_,kFatalFailure,
                                             "/workspace/llm4binary/github/license_all_cmakelists_1510/dcdpr[P]libbech32/test/testbech32/test_Bech32.cpp"
                                             ,0x26a,pcVar3);
                                  testing::internal::AssertHelper::operator=
                                            ((AssertHelper *)&gtest_ar_16.message_,&local_3d8);
                                  testing::internal::AssertHelper::~AssertHelper
                                            ((AssertHelper *)&gtest_ar_16.message_);
                                  testing::Message::~Message(&local_3d8);
                                }
                                gtest_ar_1.message_._M_t.
                                super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                ._M_t.
                                super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                .
                                super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                                ._M_head_impl._5_3_ = 0;
                                gtest_ar_1.message_._M_t.
                                super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                ._M_t.
                                super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                .
                                super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                                ._M_head_impl._4_1_ = !bVar1;
                                testing::AssertionResult::~AssertionResult
                                          ((AssertionResult *)local_3c8);
                                if (gtest_ar_1.message_._M_t.
                                    super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                    ._M_t.
                                    super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                    .
                                    super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                                    ._M_head_impl._4_4_ == 0) {
                                  pvVar2 = std::
                                           vector<unsigned_char,_std::allocator<unsigned_char>_>::
                                           operator[]((
                                                  vector<unsigned_char,_std::allocator<unsigned_char>_>
                                                  *)&gtest_ar.message_,2);
                                  local_3f1 = '\x15';
                                  testing::internal::EqHelper::Compare<unsigned_char,_char,_nullptr>
                                            ((EqHelper *)local_3f0,"checksum[2]","\'\\x15\'",pvVar2,
                                             &local_3f1);
                                  bVar1 = testing::AssertionResult::operator_cast_to_bool
                                                    ((AssertionResult *)local_3f0);
                                  if (!bVar1) {
                                    testing::Message::Message(&local_400);
                                    pcVar3 = testing::AssertionResult::failure_message
                                                       ((AssertionResult *)local_3f0);
                                    testing::internal::AssertHelper::AssertHelper
                                              ((AssertHelper *)&gtest_ar_17.message_,kFatalFailure,
                                               "/workspace/llm4binary/github/license_all_cmakelists_1510/dcdpr[P]libbech32/test/testbech32/test_Bech32.cpp"
                                               ,0x26b,pcVar3);
                                    testing::internal::AssertHelper::operator=
                                              ((AssertHelper *)&gtest_ar_17.message_,&local_400);
                                    testing::internal::AssertHelper::~AssertHelper
                                              ((AssertHelper *)&gtest_ar_17.message_);
                                    testing::Message::~Message(&local_400);
                                  }
                                  gtest_ar_1.message_._M_t.
                                  super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                  ._M_t.
                                  super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                  .
                                  super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                                  ._M_head_impl._5_3_ = 0;
                                  gtest_ar_1.message_._M_t.
                                  super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                  ._M_t.
                                  super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                  .
                                  super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                                  ._M_head_impl._4_1_ = !bVar1;
                                  testing::AssertionResult::~AssertionResult
                                            ((AssertionResult *)local_3f0);
                                  if (gtest_ar_1.message_._M_t.
                                      super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                      ._M_t.
                                      super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                      .
                                      super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                                      ._M_head_impl._4_4_ == 0) {
                                    pvVar2 = std::
                                             vector<unsigned_char,_std::allocator<unsigned_char>_>::
                                             operator[]((
                                                  vector<unsigned_char,_std::allocator<unsigned_char>_>
                                                  *)&gtest_ar.message_,3);
                                    local_419 = '\x15';
                                    testing::internal::EqHelper::
                                    Compare<unsigned_char,_char,_nullptr>
                                              ((EqHelper *)local_418,"checksum[3]","\'\\x15\'",
                                               pvVar2,&local_419);
                                    bVar1 = testing::AssertionResult::operator_cast_to_bool
                                                      ((AssertionResult *)local_418);
                                    if (!bVar1) {
                                      testing::Message::Message(&local_428);
                                      pcVar3 = testing::AssertionResult::failure_message
                                                         ((AssertionResult *)local_418);
                                      testing::internal::AssertHelper::AssertHelper
                                                ((AssertHelper *)&gtest_ar_18.message_,kFatalFailure
                                                 ,
                                                 "/workspace/llm4binary/github/license_all_cmakelists_1510/dcdpr[P]libbech32/test/testbech32/test_Bech32.cpp"
                                                 ,0x26c,pcVar3);
                                      testing::internal::AssertHelper::operator=
                                                ((AssertHelper *)&gtest_ar_18.message_,&local_428);
                                      testing::internal::AssertHelper::~AssertHelper
                                                ((AssertHelper *)&gtest_ar_18.message_);
                                      testing::Message::~Message(&local_428);
                                    }
                                    gtest_ar_1.message_._M_t.
                                    super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                    ._M_t.
                                    super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                    .
                                    super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                                    ._M_head_impl._5_3_ = 0;
                                    gtest_ar_1.message_._M_t.
                                    super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                    ._M_t.
                                    super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                    .
                                    super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                                    ._M_head_impl._4_1_ = !bVar1;
                                    testing::AssertionResult::~AssertionResult
                                              ((AssertionResult *)local_418);
                                    if (gtest_ar_1.message_._M_t.
                                        super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                        ._M_t.
                                        super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                        .
                                        super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                                        ._M_head_impl._4_4_ == 0) {
                                      pvVar2 = std::
                                               vector<unsigned_char,_std::allocator<unsigned_char>_>
                                               ::operator[]((
                                                  vector<unsigned_char,_std::allocator<unsigned_char>_>
                                                  *)&gtest_ar.message_,4);
                                      local_441 = '\x14';
                                      testing::internal::EqHelper::
                                      Compare<unsigned_char,_char,_nullptr>
                                                ((EqHelper *)local_440,"checksum[4]","\'\\x14\'",
                                                 pvVar2,&local_441);
                                      bVar1 = testing::AssertionResult::operator_cast_to_bool
                                                        ((AssertionResult *)local_440);
                                      if (!bVar1) {
                                        testing::Message::Message(&local_450);
                                        pcVar3 = testing::AssertionResult::failure_message
                                                           ((AssertionResult *)local_440);
                                        testing::internal::AssertHelper::AssertHelper
                                                  ((AssertHelper *)&gtest_ar_19.message_,
                                                   kFatalFailure,
                                                                                                      
                                                  "/workspace/llm4binary/github/license_all_cmakelists_1510/dcdpr[P]libbech32/test/testbech32/test_Bech32.cpp"
                                                  ,0x26d,pcVar3);
                                        testing::internal::AssertHelper::operator=
                                                  ((AssertHelper *)&gtest_ar_19.message_,&local_450)
                                        ;
                                        testing::internal::AssertHelper::~AssertHelper
                                                  ((AssertHelper *)&gtest_ar_19.message_);
                                        testing::Message::~Message(&local_450);
                                      }
                                      gtest_ar_1.message_._M_t.
                                      super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                      ._M_t.
                                      super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                      .
                                      super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                                      ._M_head_impl._5_3_ = 0;
                                      gtest_ar_1.message_._M_t.
                                      super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                      ._M_t.
                                      super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                      .
                                      super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                                      ._M_head_impl._4_1_ = !bVar1;
                                      testing::AssertionResult::~AssertionResult
                                                ((AssertionResult *)local_440);
                                      if (gtest_ar_1.message_._M_t.
                                          super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                          ._M_t.
                                          super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                          .
                                          super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                                          ._M_head_impl._4_4_ == 0) {
                                        pvVar2 = std::
                                                 vector<unsigned_char,_std::allocator<unsigned_char>_>
                                                 ::operator[]((
                                                  vector<unsigned_char,_std::allocator<unsigned_char>_>
                                                  *)&gtest_ar.message_,5);
                                        local_469 = '\f';
                                        testing::internal::EqHelper::
                                        Compare<unsigned_char,_char,_nullptr>
                                                  ((EqHelper *)local_468,"checksum[5]","\'\\x0C\'",
                                                   pvVar2,&local_469);
                                        bVar1 = testing::AssertionResult::operator_cast_to_bool
                                                          ((AssertionResult *)local_468);
                                        if (!bVar1) {
                                          testing::Message::Message(&local_478);
                                          pcVar3 = testing::AssertionResult::failure_message
                                                             ((AssertionResult *)local_468);
                                          testing::internal::AssertHelper::AssertHelper
                                                    (&local_480,kFatalFailure,
                                                                                                          
                                                  "/workspace/llm4binary/github/license_all_cmakelists_1510/dcdpr[P]libbech32/test/testbech32/test_Bech32.cpp"
                                                  ,0x26e,pcVar3);
                                          testing::internal::AssertHelper::operator=
                                                    (&local_480,&local_478);
                                          testing::internal::AssertHelper::~AssertHelper(&local_480)
                                          ;
                                          testing::Message::~Message(&local_478);
                                        }
                                        gtest_ar_1.message_._M_t.
                                        super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                        ._M_t.
                                        super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                        .
                                        super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                                        ._M_head_impl._5_3_ = 0;
                                        gtest_ar_1.message_._M_t.
                                        super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                        ._M_t.
                                        super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                        .
                                        super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                                        ._M_head_impl._4_1_ = !bVar1;
                                        testing::AssertionResult::~AssertionResult
                                                  ((AssertionResult *)local_468);
                                        if (gtest_ar_1.message_._M_t.
                                            super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                            ._M_t.
                                            super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                            .
                                            super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                                            ._M_head_impl._4_4_ == 0) {
                                          (anonymous_namespace)::mapToCharset_abi_cxx11_
                                                    ((string *)&gtest_ar_20.message_,
                                                     (_anonymous_namespace_ *)&gtest_ar.message_,
                                                     data_02);
                                          std::__cxx11::string::operator=
                                                    ((string *)&gtest_ar_6.message_,
                                                     (string *)&gtest_ar_20.message_);
                                          std::__cxx11::string::~string
                                                    ((string *)&gtest_ar_20.message_);
                                          testing::internal::EqHelper::
                                          Compare<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_char[7],_nullptr>
                                                    ((EqHelper *)local_4b0,"mapped","\"lc445v\"",
                                                     (
                                                  basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                                  *)&gtest_ar_6.message_,(char (*) [7])0x206612);
                                          bVar1 = testing::AssertionResult::operator_cast_to_bool
                                                            ((AssertionResult *)local_4b0);
                                          if (!bVar1) {
                                            testing::Message::Message(&local_4b8);
                                            pcVar3 = testing::AssertionResult::failure_message
                                                               ((AssertionResult *)local_4b0);
                                            testing::internal::AssertHelper::AssertHelper
                                                      (&local_4c0,kFatalFailure,
                                                                                                              
                                                  "/workspace/llm4binary/github/license_all_cmakelists_1510/dcdpr[P]libbech32/test/testbech32/test_Bech32.cpp"
                                                  ,0x272,pcVar3);
                                            testing::internal::AssertHelper::operator=
                                                      (&local_4c0,&local_4b8);
                                            testing::internal::AssertHelper::~AssertHelper
                                                      (&local_4c0);
                                            testing::Message::~Message(&local_4b8);
                                          }
                                          gtest_ar_1.message_._M_t.
                                          super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                          ._M_t.
                                          super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                          .
                                          super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                                          ._M_head_impl._5_3_ = 0;
                                          gtest_ar_1.message_._M_t.
                                          super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                          ._M_t.
                                          super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                          .
                                          super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                                          ._M_head_impl._4_1_ = !bVar1;
                                          testing::AssertionResult::~AssertionResult
                                                    ((AssertionResult *)local_4b0);
                                          if (gtest_ar_1.message_._M_t.
                                              super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                              ._M_t.
                                              super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                              .
                                              super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                                              ._M_head_impl._4_4_ == 0) {
                                            std::__cxx11::string::operator=
                                                      ((string *)local_30,
                                                                                                              
                                                  "an83characterlonghumanreadablepartthatcontainsthetheexcludedcharactersbioandnumber1"
                                                  );
                                            std::initializer_list<unsigned_char>::initializer_list
                                                      (&local_4d0);
                                            std::
                                            vector<unsigned_char,_std::allocator<unsigned_char>_>::
                                            operator=((
                                                  vector<unsigned_char,_std::allocator<unsigned_char>_>
                                                  *)&checksum.
                                                  super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
                                                  ._M_impl.super__Vector_impl_data._M_end_of_storage
                                                  ,local_4d0);
                                            anon_unknown.dwarf_3638a::mapDP
                                                      ((
                                                  vector<unsigned_char,_std::allocator<unsigned_char>_>
                                                  *)&checksum.
                                                  super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
                                                  ._M_impl.super__Vector_impl_data._M_end_of_storage
                                                  );
                                            anon_unknown.dwarf_3638a::createChecksum
                                                      ((
                                                  vector<unsigned_char,_std::allocator<unsigned_char>_>
                                                  *)&gtest_ar_21.message_,(string *)local_30,
                                                  (
                                                  vector<unsigned_char,_std::allocator<unsigned_char>_>
                                                  *)&checksum.
                                                  super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
                                                  ._M_impl.super__Vector_impl_data._M_end_of_storage
                                                  );
                                            std::
                                            vector<unsigned_char,_std::allocator<unsigned_char>_>::
                                            operator=((
                                                  vector<unsigned_char,_std::allocator<unsigned_char>_>
                                                  *)&gtest_ar.message_,
                                                  (
                                                  vector<unsigned_char,_std::allocator<unsigned_char>_>
                                                  *)&gtest_ar_21.message_);
                                            std::
                                            vector<unsigned_char,_std::allocator<unsigned_char>_>::
                                            ~vector((
                                                  vector<unsigned_char,_std::allocator<unsigned_char>_>
                                                  *)&gtest_ar_21.message_);
                                            pvVar2 = std::
                                                  vector<unsigned_char,_std::allocator<unsigned_char>_>
                                                  ::operator[]((
                                                  vector<unsigned_char,_std::allocator<unsigned_char>_>
                                                  *)&gtest_ar.message_,0);
                                            local_4f9 = '\x10';
                                            testing::internal::EqHelper::
                                            Compare<unsigned_char,_char,_nullptr>
                                                      ((EqHelper *)local_4f8,"checksum[0]",
                                                       "\'\\x10\'",pvVar2,&local_4f9);
                                            bVar1 = testing::AssertionResult::operator_cast_to_bool
                                                              ((AssertionResult *)local_4f8);
                                            if (!bVar1) {
                                              testing::Message::Message(&local_508);
                                              pcVar3 = testing::AssertionResult::failure_message
                                                                 ((AssertionResult *)local_4f8);
                                              testing::internal::AssertHelper::AssertHelper
                                                        ((AssertHelper *)&gtest_ar_22.message_,
                                                         kFatalFailure,
                                                                                                                  
                                                  "/workspace/llm4binary/github/license_all_cmakelists_1510/dcdpr[P]libbech32/test/testbech32/test_Bech32.cpp"
                                                  ,0x27c,pcVar3);
                                              testing::internal::AssertHelper::operator=
                                                        ((AssertHelper *)&gtest_ar_22.message_,
                                                         &local_508);
                                              testing::internal::AssertHelper::~AssertHelper
                                                        ((AssertHelper *)&gtest_ar_22.message_);
                                              testing::Message::~Message(&local_508);
                                            }
                                            gtest_ar_1.message_._M_t.
                                            super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                            ._M_t.
                                            super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                            .
                                            super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                                            ._M_head_impl._5_3_ = 0;
                                            gtest_ar_1.message_._M_t.
                                            super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                            ._M_t.
                                            super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                            .
                                            super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                                            ._M_head_impl._4_1_ = !bVar1;
                                            testing::AssertionResult::~AssertionResult
                                                      ((AssertionResult *)local_4f8);
                                            if (gtest_ar_1.message_._M_t.
                                                super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                                ._M_t.
                                                super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                                .
                                                super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                                                ._M_head_impl._4_4_ == 0) {
                                              pvVar2 = std::
                                                  vector<unsigned_char,_std::allocator<unsigned_char>_>
                                                  ::operator[]((
                                                  vector<unsigned_char,_std::allocator<unsigned_char>_>
                                                  *)&gtest_ar.message_,1);
                                              local_521 = '\b';
                                              testing::internal::EqHelper::
                                              Compare<unsigned_char,_char,_nullptr>
                                                        ((EqHelper *)local_520,"checksum[1]",
                                                         "\'\\x08\'",pvVar2,&local_521);
                                              bVar1 = testing::AssertionResult::
                                                      operator_cast_to_bool
                                                                ((AssertionResult *)local_520);
                                              if (!bVar1) {
                                                testing::Message::Message(&local_530);
                                                pcVar3 = testing::AssertionResult::failure_message
                                                                   ((AssertionResult *)local_520);
                                                testing::internal::AssertHelper::AssertHelper
                                                          ((AssertHelper *)&gtest_ar_23.message_,
                                                           kFatalFailure,
                                                                                                                      
                                                  "/workspace/llm4binary/github/license_all_cmakelists_1510/dcdpr[P]libbech32/test/testbech32/test_Bech32.cpp"
                                                  ,0x27d,pcVar3);
                                                testing::internal::AssertHelper::operator=
                                                          ((AssertHelper *)&gtest_ar_23.message_,
                                                           &local_530);
                                                testing::internal::AssertHelper::~AssertHelper
                                                          ((AssertHelper *)&gtest_ar_23.message_);
                                                testing::Message::~Message(&local_530);
                                              }
                                              gtest_ar_1.message_._M_t.
                                              super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                              ._M_t.
                                              super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                              .
                                              super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                                              ._M_head_impl._5_3_ = 0;
                                              gtest_ar_1.message_._M_t.
                                              super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                              ._M_t.
                                              super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                              .
                                              super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                                              ._M_head_impl._4_1_ = !bVar1;
                                              testing::AssertionResult::~AssertionResult
                                                        ((AssertionResult *)local_520);
                                              if (gtest_ar_1.message_._M_t.
                                                  super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                                  ._M_t.
                                                  super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                                  .
                                                  super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                                                  ._M_head_impl._4_4_ == 0) {
                                                pvVar2 = std::
                                                  vector<unsigned_char,_std::allocator<unsigned_char>_>
                                                  ::operator[]((
                                                  vector<unsigned_char,_std::allocator<unsigned_char>_>
                                                  *)&gtest_ar.message_,2);
                                                local_549 = '\x1e';
                                                testing::internal::EqHelper::
                                                Compare<unsigned_char,_char,_nullptr>
                                                          ((EqHelper *)local_548,"checksum[2]",
                                                           "\'\\x1E\'",pvVar2,&local_549);
                                                bVar1 = testing::AssertionResult::
                                                        operator_cast_to_bool
                                                                  ((AssertionResult *)local_548);
                                                if (!bVar1) {
                                                  testing::Message::Message(&local_558);
                                                  pcVar3 = testing::AssertionResult::failure_message
                                                                     ((AssertionResult *)local_548);
                                                  testing::internal::AssertHelper::AssertHelper
                                                            ((AssertHelper *)&gtest_ar_24.message_,
                                                             kFatalFailure,
                                                                                                                          
                                                  "/workspace/llm4binary/github/license_all_cmakelists_1510/dcdpr[P]libbech32/test/testbech32/test_Bech32.cpp"
                                                  ,0x27e,pcVar3);
                                                  testing::internal::AssertHelper::operator=
                                                            ((AssertHelper *)&gtest_ar_24.message_,
                                                             &local_558);
                                                  testing::internal::AssertHelper::~AssertHelper
                                                            ((AssertHelper *)&gtest_ar_24.message_);
                                                  testing::Message::~Message(&local_558);
                                                }
                                                gtest_ar_1.message_._M_t.
                                                super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                                ._M_t.
                                                super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                                .
                                                super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                                                ._M_head_impl._5_3_ = 0;
                                                gtest_ar_1.message_._M_t.
                                                super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                                ._M_t.
                                                super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                                .
                                                super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                                                ._M_head_impl._4_1_ = !bVar1;
                                                testing::AssertionResult::~AssertionResult
                                                          ((AssertionResult *)local_548);
                                                if (gtest_ar_1.message_._M_t.
                                                                                                        
                                                  super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                                  ._M_t.
                                                  super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                                  .
                                                  super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                                                  ._M_head_impl._4_4_ == 0) {
                                                  pvVar2 = std::
                                                  vector<unsigned_char,_std::allocator<unsigned_char>_>
                                                  ::operator[]((
                                                  vector<unsigned_char,_std::allocator<unsigned_char>_>
                                                  *)&gtest_ar.message_,3);
                                                  local_571 = '\x17';
                                                  testing::internal::EqHelper::
                                                  Compare<unsigned_char,_char,_nullptr>
                                                            ((EqHelper *)local_570,"checksum[3]",
                                                             "\'\\x17\'",pvVar2,&local_571);
                                                  bVar1 = testing::AssertionResult::
                                                          operator_cast_to_bool
                                                                    ((AssertionResult *)local_570);
                                                  if (!bVar1) {
                                                    testing::Message::Message(&local_580);
                                                    pcVar3 = testing::AssertionResult::
                                                             failure_message((AssertionResult *)
                                                                             local_570);
                                                    testing::internal::AssertHelper::AssertHelper
                                                              ((AssertHelper *)&gtest_ar_25.message_
                                                               ,kFatalFailure,
                                                                                                                              
                                                  "/workspace/llm4binary/github/license_all_cmakelists_1510/dcdpr[P]libbech32/test/testbech32/test_Bech32.cpp"
                                                  ,0x27f,pcVar3);
                                                  testing::internal::AssertHelper::operator=
                                                            ((AssertHelper *)&gtest_ar_25.message_,
                                                             &local_580);
                                                  testing::internal::AssertHelper::~AssertHelper
                                                            ((AssertHelper *)&gtest_ar_25.message_);
                                                  testing::Message::~Message(&local_580);
                                                  }
                                                  gtest_ar_1.message_._M_t.
                                                  super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                                  ._M_t.
                                                  super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                                  .
                                                  super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                                                  ._M_head_impl._5_3_ = 0;
                                                  gtest_ar_1.message_._M_t.
                                                  super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                                  ._M_t.
                                                  super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                                  .
                                                  super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                                                  ._M_head_impl._4_1_ = !bVar1;
                                                  testing::AssertionResult::~AssertionResult
                                                            ((AssertionResult *)local_570);
                                                  if (gtest_ar_1.message_._M_t.
                                                                                                            
                                                  super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                                  ._M_t.
                                                  super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                                  .
                                                  super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                                                  ._M_head_impl._4_4_ == 0) {
                                                    pvVar2 = std::
                                                  vector<unsigned_char,_std::allocator<unsigned_char>_>
                                                  ::operator[]((
                                                  vector<unsigned_char,_std::allocator<unsigned_char>_>
                                                  *)&gtest_ar.message_,4);
                                                  local_599 = '\b';
                                                  testing::internal::EqHelper::
                                                  Compare<unsigned_char,_char,_nullptr>
                                                            ((EqHelper *)local_598,"checksum[4]",
                                                             "\'\\x08\'",pvVar2,&local_599);
                                                  bVar1 = testing::AssertionResult::
                                                          operator_cast_to_bool
                                                                    ((AssertionResult *)local_598);
                                                  if (!bVar1) {
                                                    testing::Message::Message(&local_5a8);
                                                    pcVar3 = testing::AssertionResult::
                                                             failure_message((AssertionResult *)
                                                                             local_598);
                                                    testing::internal::AssertHelper::AssertHelper
                                                              ((AssertHelper *)&gtest_ar_26.message_
                                                               ,kFatalFailure,
                                                                                                                              
                                                  "/workspace/llm4binary/github/license_all_cmakelists_1510/dcdpr[P]libbech32/test/testbech32/test_Bech32.cpp"
                                                  ,0x280,pcVar3);
                                                  testing::internal::AssertHelper::operator=
                                                            ((AssertHelper *)&gtest_ar_26.message_,
                                                             &local_5a8);
                                                  testing::internal::AssertHelper::~AssertHelper
                                                            ((AssertHelper *)&gtest_ar_26.message_);
                                                  testing::Message::~Message(&local_5a8);
                                                  }
                                                  gtest_ar_1.message_._M_t.
                                                  super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                                  ._M_t.
                                                  super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                                  .
                                                  super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                                                  ._M_head_impl._5_3_ = 0;
                                                  gtest_ar_1.message_._M_t.
                                                  super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                                  ._M_t.
                                                  super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                                  .
                                                  super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                                                  ._M_head_impl._4_1_ = !bVar1;
                                                  testing::AssertionResult::~AssertionResult
                                                            ((AssertionResult *)local_598);
                                                  if (gtest_ar_1.message_._M_t.
                                                                                                            
                                                  super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                                  ._M_t.
                                                  super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                                  .
                                                  super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                                                  ._M_head_impl._4_4_ == 0) {
                                                    pvVar2 = std::
                                                  vector<unsigned_char,_std::allocator<unsigned_char>_>
                                                  ::operator[]((
                                                  vector<unsigned_char,_std::allocator<unsigned_char>_>
                                                  *)&gtest_ar.message_,5);
                                                  local_5c1 = '\x1a';
                                                  testing::internal::EqHelper::
                                                  Compare<unsigned_char,_char,_nullptr>
                                                            ((EqHelper *)local_5c0,"checksum[5]",
                                                             "\'\\x1A\'",pvVar2,&local_5c1);
                                                  bVar1 = testing::AssertionResult::
                                                          operator_cast_to_bool
                                                                    ((AssertionResult *)local_5c0);
                                                  if (!bVar1) {
                                                    testing::Message::Message(&local_5d0);
                                                    pcVar3 = testing::AssertionResult::
                                                             failure_message((AssertionResult *)
                                                                             local_5c0);
                                                    testing::internal::AssertHelper::AssertHelper
                                                              (&local_5d8,kFatalFailure,
                                                                                                                              
                                                  "/workspace/llm4binary/github/license_all_cmakelists_1510/dcdpr[P]libbech32/test/testbech32/test_Bech32.cpp"
                                                  ,0x281,pcVar3);
                                                  testing::internal::AssertHelper::operator=
                                                            (&local_5d8,&local_5d0);
                                                  testing::internal::AssertHelper::~AssertHelper
                                                            (&local_5d8);
                                                  testing::Message::~Message(&local_5d0);
                                                  }
                                                  gtest_ar_1.message_._M_t.
                                                  super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                                  ._M_t.
                                                  super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                                  .
                                                  super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                                                  ._M_head_impl._5_3_ = 0;
                                                  gtest_ar_1.message_._M_t.
                                                  super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                                  ._M_t.
                                                  super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                                  .
                                                  super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                                                  ._M_head_impl._4_1_ = !bVar1;
                                                  testing::AssertionResult::~AssertionResult
                                                            ((AssertionResult *)local_5c0);
                                                  if (gtest_ar_1.message_._M_t.
                                                                                                            
                                                  super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                                  ._M_t.
                                                  super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                                  .
                                                  super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                                                  ._M_head_impl._4_4_ == 0) {
                                                    (anonymous_namespace)::mapToCharset_abi_cxx11_
                                                              ((string *)&gtest_ar_27.message_,
                                                               (_anonymous_namespace_ *)
                                                               &gtest_ar.message_,data_03);
                                                    std::__cxx11::string::operator=
                                                              ((string *)&gtest_ar_6.message_,
                                                               (string *)&gtest_ar_27.message_);
                                                    std::__cxx11::string::~string
                                                              ((string *)&gtest_ar_27.message_);
                                                    testing::internal::EqHelper::
                                                                                                        
                                                  Compare<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_char[7],_nullptr>
                                                            ((EqHelper *)local_608,"mapped",
                                                             "\"sg7hg6\"",
                                                             (
                                                  basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                                  *)&gtest_ar_6.message_,(char (*) [7])0x20666d);
                                                  bVar1 = testing::AssertionResult::
                                                          operator_cast_to_bool
                                                                    ((AssertionResult *)local_608);
                                                  if (!bVar1) {
                                                    testing::Message::Message(&local_610);
                                                    pcVar3 = testing::AssertionResult::
                                                             failure_message((AssertionResult *)
                                                                             local_608);
                                                    testing::internal::AssertHelper::AssertHelper
                                                              (&local_618,kFatalFailure,
                                                                                                                              
                                                  "/workspace/llm4binary/github/license_all_cmakelists_1510/dcdpr[P]libbech32/test/testbech32/test_Bech32.cpp"
                                                  ,0x285,pcVar3);
                                                  testing::internal::AssertHelper::operator=
                                                            (&local_618,&local_610);
                                                  testing::internal::AssertHelper::~AssertHelper
                                                            (&local_618);
                                                  testing::Message::~Message(&local_610);
                                                  }
                                                  gtest_ar_1.message_._M_t.
                                                  super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                                  ._M_t.
                                                  super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                                  .
                                                  super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                                                  ._M_head_impl._5_3_ = 0;
                                                  gtest_ar_1.message_._M_t.
                                                  super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                                  ._M_t.
                                                  super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                                  .
                                                  super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                                                  ._M_head_impl._4_1_ = !bVar1;
                                                  testing::AssertionResult::~AssertionResult
                                                            ((AssertionResult *)local_608);
                                                  if (gtest_ar_1.message_._M_t.
                                                                                                            
                                                  super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                                  ._M_t.
                                                  super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                                  .
                                                  super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                                                  ._M_head_impl._4_4_ == 0) {
                                                    std::__cxx11::string::operator=
                                                              ((string *)local_30,"1");
                                                    builtin_memcpy(local_688,
                                                                                                                                      
                                                  "llllllllllllllllllllllllllllllllllllllllllllllllllllllllllllllllllllllllllllllllll"
                                                  ,0x52);
                                                  local_628 = local_688;
                                                  local_620 = 0x52;
                                                  __l._M_len = 0x52;
                                                  __l._M_array = local_628;
                                                  std::
                                                  vector<unsigned_char,_std::allocator<unsigned_char>_>
                                                  ::operator=((
                                                  vector<unsigned_char,_std::allocator<unsigned_char>_>
                                                  *)&checksum.
                                                  super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
                                                  ._M_impl.super__Vector_impl_data._M_end_of_storage
                                                  ,__l);
                                                  anon_unknown.dwarf_3638a::mapDP
                                                            ((
                                                  vector<unsigned_char,_std::allocator<unsigned_char>_>
                                                  *)&checksum.
                                                  super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
                                                  ._M_impl.super__Vector_impl_data._M_end_of_storage
                                                  );
                                                  anon_unknown.dwarf_3638a::createChecksum
                                                            ((
                                                  vector<unsigned_char,_std::allocator<unsigned_char>_>
                                                  *)&gtest_ar_28.message_,(string *)local_30,
                                                  (
                                                  vector<unsigned_char,_std::allocator<unsigned_char>_>
                                                  *)&checksum.
                                                  super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
                                                  ._M_impl.super__Vector_impl_data._M_end_of_storage
                                                  );
                                                  std::
                                                  vector<unsigned_char,_std::allocator<unsigned_char>_>
                                                  ::operator=((
                                                  vector<unsigned_char,_std::allocator<unsigned_char>_>
                                                  *)&gtest_ar.message_,
                                                  (
                                                  vector<unsigned_char,_std::allocator<unsigned_char>_>
                                                  *)&gtest_ar_28.message_);
                                                  std::
                                                  vector<unsigned_char,_std::allocator<unsigned_char>_>
                                                  ::~vector((
                                                  vector<unsigned_char,_std::allocator<unsigned_char>_>
                                                  *)&gtest_ar_28.message_);
                                                  pvVar2 = std::
                                                  vector<unsigned_char,_std::allocator<unsigned_char>_>
                                                  ::operator[]((
                                                  vector<unsigned_char,_std::allocator<unsigned_char>_>
                                                  *)&gtest_ar.message_,0);
                                                  local_6b1 = '\x1f';
                                                  testing::internal::EqHelper::
                                                  Compare<unsigned_char,_char,_nullptr>
                                                            ((EqHelper *)local_6b0,"checksum[0]",
                                                             "\'\\x1F\'",pvVar2,&local_6b1);
                                                  bVar1 = testing::AssertionResult::
                                                          operator_cast_to_bool
                                                                    ((AssertionResult *)local_6b0);
                                                  if (!bVar1) {
                                                    testing::Message::Message(&local_6c0);
                                                    pcVar3 = testing::AssertionResult::
                                                             failure_message((AssertionResult *)
                                                                             local_6b0);
                                                    testing::internal::AssertHelper::AssertHelper
                                                              ((AssertHelper *)&gtest_ar_29.message_
                                                               ,kFatalFailure,
                                                                                                                              
                                                  "/workspace/llm4binary/github/license_all_cmakelists_1510/dcdpr[P]libbech32/test/testbech32/test_Bech32.cpp"
                                                  ,0x293,pcVar3);
                                                  testing::internal::AssertHelper::operator=
                                                            ((AssertHelper *)&gtest_ar_29.message_,
                                                             &local_6c0);
                                                  testing::internal::AssertHelper::~AssertHelper
                                                            ((AssertHelper *)&gtest_ar_29.message_);
                                                  testing::Message::~Message(&local_6c0);
                                                  }
                                                  gtest_ar_1.message_._M_t.
                                                  super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                                  ._M_t.
                                                  super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                                  .
                                                  super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                                                  ._M_head_impl._5_3_ = 0;
                                                  gtest_ar_1.message_._M_t.
                                                  super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                                  ._M_t.
                                                  super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                                  .
                                                  super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                                                  ._M_head_impl._4_1_ = !bVar1;
                                                  testing::AssertionResult::~AssertionResult
                                                            ((AssertionResult *)local_6b0);
                                                  if (gtest_ar_1.message_._M_t.
                                                                                                            
                                                  super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                                  ._M_t.
                                                  super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                                  .
                                                  super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                                                  ._M_head_impl._4_4_ == 0) {
                                                    pvVar2 = std::
                                                  vector<unsigned_char,_std::allocator<unsigned_char>_>
                                                  ::operator[]((
                                                  vector<unsigned_char,_std::allocator<unsigned_char>_>
                                                  *)&gtest_ar.message_,1);
                                                  local_6d9 = '\x1c';
                                                  testing::internal::EqHelper::
                                                  Compare<unsigned_char,_char,_nullptr>
                                                            ((EqHelper *)local_6d8,"checksum[1]",
                                                             "\'\\x1C\'",pvVar2,&local_6d9);
                                                  bVar1 = testing::AssertionResult::
                                                          operator_cast_to_bool
                                                                    ((AssertionResult *)local_6d8);
                                                  if (!bVar1) {
                                                    testing::Message::Message(&local_6e8);
                                                    pcVar3 = testing::AssertionResult::
                                                             failure_message((AssertionResult *)
                                                                             local_6d8);
                                                    testing::internal::AssertHelper::AssertHelper
                                                              ((AssertHelper *)&gtest_ar_30.message_
                                                               ,kFatalFailure,
                                                                                                                              
                                                  "/workspace/llm4binary/github/license_all_cmakelists_1510/dcdpr[P]libbech32/test/testbech32/test_Bech32.cpp"
                                                  ,0x294,pcVar3);
                                                  testing::internal::AssertHelper::operator=
                                                            ((AssertHelper *)&gtest_ar_30.message_,
                                                             &local_6e8);
                                                  testing::internal::AssertHelper::~AssertHelper
                                                            ((AssertHelper *)&gtest_ar_30.message_);
                                                  testing::Message::~Message(&local_6e8);
                                                  }
                                                  gtest_ar_1.message_._M_t.
                                                  super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                                  ._M_t.
                                                  super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                                  .
                                                  super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                                                  ._M_head_impl._5_3_ = 0;
                                                  gtest_ar_1.message_._M_t.
                                                  super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                                  ._M_t.
                                                  super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                                  .
                                                  super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                                                  ._M_head_impl._4_1_ = !bVar1;
                                                  testing::AssertionResult::~AssertionResult
                                                            ((AssertionResult *)local_6d8);
                                                  if (gtest_ar_1.message_._M_t.
                                                                                                            
                                                  super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                                  ._M_t.
                                                  super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                                  .
                                                  super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                                                  ._M_head_impl._4_4_ == 0) {
                                                    pvVar2 = std::
                                                  vector<unsigned_char,_std::allocator<unsigned_char>_>
                                                  ::operator[]((
                                                  vector<unsigned_char,_std::allocator<unsigned_char>_>
                                                  *)&gtest_ar.message_,2);
                                                  local_701 = '\r';
                                                  testing::internal::EqHelper::
                                                  Compare<unsigned_char,_char,_nullptr>
                                                            ((EqHelper *)local_700,"checksum[2]",
                                                             "\'\\x0D\'",pvVar2,&local_701);
                                                  bVar1 = testing::AssertionResult::
                                                          operator_cast_to_bool
                                                                    ((AssertionResult *)local_700);
                                                  if (!bVar1) {
                                                    testing::Message::Message(&local_710);
                                                    pcVar3 = testing::AssertionResult::
                                                             failure_message((AssertionResult *)
                                                                             local_700);
                                                    testing::internal::AssertHelper::AssertHelper
                                                              ((AssertHelper *)&gtest_ar_31.message_
                                                               ,kFatalFailure,
                                                                                                                              
                                                  "/workspace/llm4binary/github/license_all_cmakelists_1510/dcdpr[P]libbech32/test/testbech32/test_Bech32.cpp"
                                                  ,0x295,pcVar3);
                                                  testing::internal::AssertHelper::operator=
                                                            ((AssertHelper *)&gtest_ar_31.message_,
                                                             &local_710);
                                                  testing::internal::AssertHelper::~AssertHelper
                                                            ((AssertHelper *)&gtest_ar_31.message_);
                                                  testing::Message::~Message(&local_710);
                                                  }
                                                  gtest_ar_1.message_._M_t.
                                                  super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                                  ._M_t.
                                                  super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                                  .
                                                  super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                                                  ._M_head_impl._5_3_ = 0;
                                                  gtest_ar_1.message_._M_t.
                                                  super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                                  ._M_t.
                                                  super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                                  .
                                                  super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                                                  ._M_head_impl._4_1_ = !bVar1;
                                                  testing::AssertionResult::~AssertionResult
                                                            ((AssertionResult *)local_700);
                                                  if (gtest_ar_1.message_._M_t.
                                                                                                            
                                                  super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                                  ._M_t.
                                                  super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                                  .
                                                  super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                                                  ._M_head_impl._4_4_ == 0) {
                                                    pvVar2 = std::
                                                  vector<unsigned_char,_std::allocator<unsigned_char>_>
                                                  ::operator[]((
                                                  vector<unsigned_char,_std::allocator<unsigned_char>_>
                                                  *)&gtest_ar.message_,3);
                                                  local_729 = '\x10';
                                                  testing::internal::EqHelper::
                                                  Compare<unsigned_char,_char,_nullptr>
                                                            ((EqHelper *)local_728,"checksum[3]",
                                                             "\'\\x10\'",pvVar2,&local_729);
                                                  bVar1 = testing::AssertionResult::
                                                          operator_cast_to_bool
                                                                    ((AssertionResult *)local_728);
                                                  if (!bVar1) {
                                                    testing::Message::Message(&local_738);
                                                    pcVar3 = testing::AssertionResult::
                                                             failure_message((AssertionResult *)
                                                                             local_728);
                                                    testing::internal::AssertHelper::AssertHelper
                                                              ((AssertHelper *)&gtest_ar_32.message_
                                                               ,kFatalFailure,
                                                                                                                              
                                                  "/workspace/llm4binary/github/license_all_cmakelists_1510/dcdpr[P]libbech32/test/testbech32/test_Bech32.cpp"
                                                  ,0x296,pcVar3);
                                                  testing::internal::AssertHelper::operator=
                                                            ((AssertHelper *)&gtest_ar_32.message_,
                                                             &local_738);
                                                  testing::internal::AssertHelper::~AssertHelper
                                                            ((AssertHelper *)&gtest_ar_32.message_);
                                                  testing::Message::~Message(&local_738);
                                                  }
                                                  gtest_ar_1.message_._M_t.
                                                  super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                                  ._M_t.
                                                  super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                                  .
                                                  super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                                                  ._M_head_impl._5_3_ = 0;
                                                  gtest_ar_1.message_._M_t.
                                                  super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                                  ._M_t.
                                                  super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                                  .
                                                  super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                                                  ._M_head_impl._4_1_ = !bVar1;
                                                  testing::AssertionResult::~AssertionResult
                                                            ((AssertionResult *)local_728);
                                                  if (gtest_ar_1.message_._M_t.
                                                                                                            
                                                  super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                                  ._M_t.
                                                  super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                                  .
                                                  super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                                                  ._M_head_impl._4_4_ == 0) {
                                                    pvVar2 = std::
                                                  vector<unsigned_char,_std::allocator<unsigned_char>_>
                                                  ::operator[]((
                                                  vector<unsigned_char,_std::allocator<unsigned_char>_>
                                                  *)&gtest_ar.message_,4);
                                                  local_751 = '\x03';
                                                  testing::internal::EqHelper::
                                                  Compare<unsigned_char,_char,_nullptr>
                                                            ((EqHelper *)local_750,"checksum[4]",
                                                             "\'\\x03\'",pvVar2,&local_751);
                                                  bVar1 = testing::AssertionResult::
                                                          operator_cast_to_bool
                                                                    ((AssertionResult *)local_750);
                                                  if (!bVar1) {
                                                    testing::Message::Message(&local_760);
                                                    pcVar3 = testing::AssertionResult::
                                                             failure_message((AssertionResult *)
                                                                             local_750);
                                                    testing::internal::AssertHelper::AssertHelper
                                                              ((AssertHelper *)&gtest_ar_33.message_
                                                               ,kFatalFailure,
                                                                                                                              
                                                  "/workspace/llm4binary/github/license_all_cmakelists_1510/dcdpr[P]libbech32/test/testbech32/test_Bech32.cpp"
                                                  ,0x297,pcVar3);
                                                  testing::internal::AssertHelper::operator=
                                                            ((AssertHelper *)&gtest_ar_33.message_,
                                                             &local_760);
                                                  testing::internal::AssertHelper::~AssertHelper
                                                            ((AssertHelper *)&gtest_ar_33.message_);
                                                  testing::Message::~Message(&local_760);
                                                  }
                                                  gtest_ar_1.message_._M_t.
                                                  super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                                  ._M_t.
                                                  super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                                  .
                                                  super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                                                  ._M_head_impl._5_3_ = 0;
                                                  gtest_ar_1.message_._M_t.
                                                  super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                                  ._M_t.
                                                  super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                                  .
                                                  super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                                                  ._M_head_impl._4_1_ = !bVar1;
                                                  testing::AssertionResult::~AssertionResult
                                                            ((AssertionResult *)local_750);
                                                  if (gtest_ar_1.message_._M_t.
                                                                                                            
                                                  super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                                  ._M_t.
                                                  super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                                  .
                                                  super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                                                  ._M_head_impl._4_4_ == 0) {
                                                    pvVar2 = std::
                                                  vector<unsigned_char,_std::allocator<unsigned_char>_>
                                                  ::operator[]((
                                                  vector<unsigned_char,_std::allocator<unsigned_char>_>
                                                  *)&gtest_ar.message_,5);
                                                  local_779 = '\a';
                                                  testing::internal::EqHelper::
                                                  Compare<unsigned_char,_char,_nullptr>
                                                            ((EqHelper *)local_778,"checksum[5]",
                                                             "\'\\x07\'",pvVar2,&local_779);
                                                  bVar1 = testing::AssertionResult::
                                                          operator_cast_to_bool
                                                                    ((AssertionResult *)local_778);
                                                  if (!bVar1) {
                                                    testing::Message::Message(&local_788);
                                                    pcVar3 = testing::AssertionResult::
                                                             failure_message((AssertionResult *)
                                                                             local_778);
                                                    testing::internal::AssertHelper::AssertHelper
                                                              (&local_790,kFatalFailure,
                                                                                                                              
                                                  "/workspace/llm4binary/github/license_all_cmakelists_1510/dcdpr[P]libbech32/test/testbech32/test_Bech32.cpp"
                                                  ,0x298,pcVar3);
                                                  testing::internal::AssertHelper::operator=
                                                            (&local_790,&local_788);
                                                  testing::internal::AssertHelper::~AssertHelper
                                                            (&local_790);
                                                  testing::Message::~Message(&local_788);
                                                  }
                                                  gtest_ar_1.message_._M_t.
                                                  super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                                  ._M_t.
                                                  super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                                  .
                                                  super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                                                  ._M_head_impl._5_3_ = 0;
                                                  gtest_ar_1.message_._M_t.
                                                  super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                                  ._M_t.
                                                  super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                                  .
                                                  super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                                                  ._M_head_impl._4_1_ = !bVar1;
                                                  testing::AssertionResult::~AssertionResult
                                                            ((AssertionResult *)local_778);
                                                  if (gtest_ar_1.message_._M_t.
                                                                                                            
                                                  super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                                  ._M_t.
                                                  super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                                  .
                                                  super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                                                  ._M_head_impl._4_4_ == 0) {
                                                    (anonymous_namespace)::mapToCharset_abi_cxx11_
                                                              ((string *)&gtest_ar_34.message_,
                                                               (_anonymous_namespace_ *)
                                                               &gtest_ar.message_,data_04);
                                                    std::__cxx11::string::operator=
                                                              ((string *)&gtest_ar_6.message_,
                                                               (string *)&gtest_ar_34.message_);
                                                    std::__cxx11::string::~string
                                                              ((string *)&gtest_ar_34.message_);
                                                    testing::internal::EqHelper::
                                                                                                        
                                                  Compare<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_char[7],_nullptr>
                                                            ((EqHelper *)local_7c0,"mapped",
                                                             "\"ludsr8\"",
                                                             (
                                                  basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                                  *)&gtest_ar_6.message_,(char (*) [7])0x2066c8);
                                                  bVar1 = testing::AssertionResult::
                                                          operator_cast_to_bool
                                                                    ((AssertionResult *)local_7c0);
                                                  if (!bVar1) {
                                                    testing::Message::Message(&local_7c8);
                                                    pcVar3 = testing::AssertionResult::
                                                             failure_message((AssertionResult *)
                                                                             local_7c0);
                                                    testing::internal::AssertHelper::AssertHelper
                                                              (&local_7d0,kFatalFailure,
                                                                                                                              
                                                  "/workspace/llm4binary/github/license_all_cmakelists_1510/dcdpr[P]libbech32/test/testbech32/test_Bech32.cpp"
                                                  ,0x29c,pcVar3);
                                                  testing::internal::AssertHelper::operator=
                                                            (&local_7d0,&local_7c8);
                                                  testing::internal::AssertHelper::~AssertHelper
                                                            (&local_7d0);
                                                  testing::Message::~Message(&local_7c8);
                                                  }
                                                  gtest_ar_1.message_._M_t.
                                                  super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                                  ._M_t.
                                                  super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                                  .
                                                  super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                                                  ._M_head_impl._5_3_ = 0;
                                                  gtest_ar_1.message_._M_t.
                                                  super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                                  ._M_t.
                                                  super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                                  .
                                                  super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                                                  ._M_head_impl._4_1_ = !bVar1;
                                                  testing::AssertionResult::~AssertionResult
                                                            ((AssertionResult *)local_7c0);
                                                  if (gtest_ar_1.message_._M_t.
                                                                                                            
                                                  super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                                  ._M_t.
                                                  super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                                  .
                                                  super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                                                  ._M_head_impl._4_4_ == 0) {
                                                    gtest_ar_1.message_._M_t.
                                                                                                        
                                                  super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                                  ._M_t.
                                                  super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                                  .
                                                  super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                                                  ._M_head_impl._4_4_ = 0;
                                                  }
                                                  }
                                                  }
                                                  }
                                                  }
                                                  }
                                                  }
                                                  }
                                                  }
                                                  }
                                                  }
                                                }
                                              }
                                            }
                                          }
                                        }
                                      }
                                    }
                                  }
                                }
                              }
                            }
                          }
                        }
                      }
                    }
                  }
                }
              }
              std::__cxx11::string::~string((string *)&gtest_ar_6.message_);
            }
          }
        }
      }
    }
  }
  std::vector<unsigned_char,_std::allocator<unsigned_char>_>::~vector
            ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)&gtest_ar.message_);
  std::vector<unsigned_char,_std::allocator<unsigned_char>_>::~vector
            ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)
             &checksum.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
              super__Vector_impl_data._M_end_of_storage);
  std::__cxx11::string::~string((string *)local_30);
  return;
}

Assistant:

TEST(Bech32Test, create_checksum) {
    std::string hrp = "a";
    std::vector<unsigned char> data;
    std::vector<unsigned char> checksum = createChecksum(hrp, data);

    ASSERT_EQ(checksum[0], '\x1F');
    ASSERT_EQ(checksum[1], '\x00');
    ASSERT_EQ(checksum[2], '\x09');
    ASSERT_EQ(checksum[3], '\x13');
    ASSERT_EQ(checksum[4], '\x11');
    ASSERT_EQ(checksum[5], '\x1D');

    std::string mapped = mapToCharset(checksum);

    ASSERT_EQ(mapped, "lqfn3a");

    ////

    hrp = "abcdef";
    data = {'l','7','a','u','m','6','e','c','h','k','4','5','n','j','3','s','0','w','d',
            'v','t','2','f','g','8','x','9','y','r','z','p','q'};

    mapDP(data);
    checksum = createChecksum(hrp, data);

    ASSERT_EQ(checksum[0], '\x02');
    ASSERT_EQ(checksum[1], '\x0D');
    ASSERT_EQ(checksum[2], '\x11');
    ASSERT_EQ(checksum[3], '\x03');
    ASSERT_EQ(checksum[4], '\x04');
    ASSERT_EQ(checksum[5], '\x06');

    mapped = mapToCharset(checksum);

    ASSERT_EQ(mapped, "zd3ryx");

    ////

    hrp = "split";
    data = {'c','h','e','c','k','u','p','s','t','a','g','e','h','a','n','d','s','h','a',
            'k','e','u','p','s','t','r','e','a','m','e','r','r','a','n','t','e','r','r',
            'e','d','c','a','p','e','r','r','e','d'};

    mapDP(data);
    checksum = createChecksum(hrp, data);

    ASSERT_EQ(checksum[0], '\x1F');
    ASSERT_EQ(checksum[1], '\x18');
    ASSERT_EQ(checksum[2], '\x15');
    ASSERT_EQ(checksum[3], '\x15');
    ASSERT_EQ(checksum[4], '\x14');
    ASSERT_EQ(checksum[5], '\x0C');

    mapped = mapToCharset(checksum);

    ASSERT_EQ(mapped, "lc445v");

    ////

    hrp = "an83characterlonghumanreadablepartthatcontainsthetheexcludedcharactersbioandnumber1";
    data = {};

    mapDP(data);
    checksum = createChecksum(hrp, data);

    ASSERT_EQ(checksum[0], '\x10');
    ASSERT_EQ(checksum[1], '\x08');
    ASSERT_EQ(checksum[2], '\x1E');
    ASSERT_EQ(checksum[3], '\x17');
    ASSERT_EQ(checksum[4], '\x08');
    ASSERT_EQ(checksum[5], '\x1A');

    mapped = mapToCharset(checksum);

    ASSERT_EQ(mapped, "sg7hg6");

    ////

    hrp = "1";
    data = {'l','l','l','l','l','l','l','l','l','l','l','l','l','l','l','l','l','l','l',
            'l','l','l','l','l','l','l','l','l','l','l','l','l','l','l','l','l','l','l',
            'l','l','l','l','l','l','l','l','l','l','l','l','l','l','l','l','l','l','l',
            'l','l','l','l','l','l','l','l','l','l','l','l','l','l','l','l','l','l','l',
            'l','l','l','l','l','l'};

    mapDP(data);
    checksum = createChecksum(hrp, data);

    ASSERT_EQ(checksum[0], '\x1F');
    ASSERT_EQ(checksum[1], '\x1C');
    ASSERT_EQ(checksum[2], '\x0D');
    ASSERT_EQ(checksum[3], '\x10');
    ASSERT_EQ(checksum[4], '\x03');
    ASSERT_EQ(checksum[5], '\x07');

    mapped = mapToCharset(checksum);

    ASSERT_EQ(mapped, "ludsr8");

}